

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_fetching.c
# Opt level: O2

void CGTFS_DatabaseFetching(void)

{
  int iVar1;
  uint uVar2;
  FILE *pFVar3;
  long lVar4;
  stop_t *local_68;
  agency_t *expected;
  feed_db_t db;
  
  iVar1 = greatest_test_pre("db_all_agencies_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/agency.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        greatest_info.fail_line = 0x12;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/agency.txt` test file";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      }
      else {
        uVar2 = read_all_agencies((FILE *)pFVar3,&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_agencies_db(&db,(agency_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x280 == 0xc80) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00116100;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_agency((agency_t *)(expected->id + lVar4),
                                   (agency_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x280;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x24;
            greatest_info.msg = "equal_agency(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x22;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x17;
          greatest_info.msg = "4 != expected_count";
        }
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
        iVar1 = -1;
      }
    }
LAB_00116100:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_calendar_dates_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/calendar_dates.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x33;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/calendar_dates.txt` test file";
      }
      else {
        uVar2 = read_all_calendar_dates((FILE *)pFVar3,(calendar_date_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 9) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_calendar_dates_db(&db,(calendar_date_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 9) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x50 == 800) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011635f;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_calendar_date((calendar_date_t *)(expected->id + lVar4),
                                          (calendar_date_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x50;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x45;
            greatest_info.msg = "equal_calendar_date(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",9);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x43;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",9);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x38;
          greatest_info.msg = "9 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_0011635f:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_calendar_records_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/calendar.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x54;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/calendar.txt` test file";
      }
      else {
        uVar2 = read_all_calendar_records((FILE *)pFVar3,(calendar_record_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_calendar_records_db(&db,(calendar_record_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x70 == 0x230) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_001165be;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_calendar_record
                                ((calendar_record_t *)(expected->id + lVar4),
                                 (calendar_record_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x70;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x66;
            greatest_info.msg = "equal_calendar_record(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 100;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x59;
          greatest_info.msg = "4 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_001165be:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_fare_attributes_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/fare_attributes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x75;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/fare_attributes.txt` test file";
      }
      else {
        uVar2 = read_all_fare_attributes((FILE *)pFVar3,(fare_attributes_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 2) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_fare_attributes_db(&db,(fare_attributes_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 2) {
            lVar4 = 0;
            do {
              if (lVar4 + 0xa0 == 0x1e0) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00116820;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_fare_attributes
                                ((fare_attributes_t *)(expected->id + lVar4),
                                 (fare_attributes_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0xa0;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x87;
            greatest_info.msg = "equal_fare_attributes(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",2);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x85;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x7a;
          greatest_info.msg = "2 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00116820:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_fare_rules_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/fare_rules.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x96;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/fare_rules.txt` test file";
      }
      else {
        uVar2 = read_all_fare_rules((FILE *)pFVar3,(fare_rule_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_fare_rules_db(&db,(fare_rule_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x140 == 0x640) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00116a82;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_fare_rule((fare_rule_t *)(expected->id + lVar4),
                                      (fare_rule_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x140;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0xa8;
            greatest_info.msg = "equal_fare_rule(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0xa6;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x9b;
          greatest_info.msg = "4 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00116a82:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_feed_info_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/feed_info.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0xb7;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/feed_info.txt` test file";
      }
      else {
        uVar2 = read_all_feed_info((FILE *)pFVar3,(feed_info_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 1) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_feed_info_db(&db,(feed_info_t **)&local_68);
          if (uVar2 == 1) {
            greatest_info.assertions = greatest_info.assertions + 2;
            iVar1 = equal_feed_info((feed_info_t *)expected,(feed_info_t *)local_68);
            if (iVar1 != 0) {
              free_feed_db(&db);
              free(local_68);
              free(expected);
              fclose(pFVar3);
              greatest_info.msg = (char *)0x0;
              iVar1 = 0;
              goto LAB_00116e0e;
            }
            greatest_info.fail_line = 0xc9;
            greatest_info.msg = "equal_feed_info(&(expected[i]), &(records[i]))";
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",1);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 199;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",1);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xbc;
          greatest_info.msg = "1 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00116e0e:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_frequencies_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/frequencies.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0xd8;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/frequencies.txt` test file";
      }
      else {
        uVar2 = read_all_frequencies((FILE *)pFVar3,(frequency_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 0xb) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_frequencies_db(&db,(frequency_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 0xb) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x5c == 0x450) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011706d;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_frequency((frequency_t *)(expected->id + lVar4),
                                      (frequency_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x5c;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0xea;
            greatest_info.msg = "equal_frequency(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",0xb);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0xe8;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0xb);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xdd;
          greatest_info.msg = "11 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_0011706d:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_levels_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/levels.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0xf9;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/levels.txt` test file";
      }
      else {
        uVar2 = read_all_levels((FILE *)pFVar3,(level_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_levels_db(&db,(level_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x88 == 0x2a8) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_001172cf;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_level((level_t *)(expected->id + lVar4),
                                  (level_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x88;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x10b;
            greatest_info.msg = "equal_level(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x109;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0xfe;
          greatest_info.msg = "4 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_001172cf:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_pathways_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/pathways.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x11a;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/pathways.txt` test file";
      }
      else {
        uVar2 = read_all_pathways((FILE *)pFVar3,(pathway_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 2) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_pathways_db(&db,(pathway_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 2) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x1e8 == 0x5b8) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00117531;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_pathway((pathway_t *)(expected->id + lVar4),
                                    (pathway_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x1e8;
            } while (iVar1 != 0);
            greatest_info.fail_line = 300;
            greatest_info.msg = "equal_pathway(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",2);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x12a;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",2);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x11f;
          greatest_info.msg = "2 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00117531:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_routes_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/routes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x13b;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/routes.txt` test file";
      }
      else {
        uVar2 = read_all_routes((FILE *)pFVar3,(route_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 8) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_routes_db(&db,(route_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 8) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x2d8 == 0x1998) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00117793;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_route((route_t *)(expected->id + lVar4),
                                  (route_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x2d8;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x14d;
            greatest_info.msg = "equal_route(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",8);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x14b;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",8);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x140;
          greatest_info.msg = "8 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00117793:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_shapes_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/shapes.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x15c;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/shapes.txt` test file";
      }
      else {
        uVar2 = read_all_shapes((FILE *)pFVar3,(shape_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 10) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_shapes_db(&db,(shape_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 10) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x70 == 0x4d0) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_001179f2;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_shape((shape_t *)(expected->id + lVar4),
                                  (shape_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x70;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x16e;
            greatest_info.msg = "equal_shape(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",10);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x16c;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",10);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x161;
          greatest_info.msg = "10 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_001179f2:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_stop_times_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/stop_times.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x17d;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/stop_times.txt` test file";
      }
      else {
        uVar2 = read_all_stop_times((FILE *)pFVar3,(stop_time_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 0x1c) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_stop_times_db(&db,(stop_time_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 0x1c) {
            lVar4 = 0;
            do {
              if (lVar4 + 0xf0 == 0x1b30) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00117c54;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_stop_time((stop_time_t *)(expected->id + lVar4),
                                      (stop_time_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0xf0;
            } while (iVar1 != 0);
            greatest_info.fail_line = 399;
            greatest_info.msg = "equal_stop_time(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",0x1c);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x18d;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",0x1c);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x182;
          greatest_info.msg = "28 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00117c54:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_stops_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/stops.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x19e;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/stops.txt` test file";
      }
      else {
        uVar2 = read_all_stops((FILE *)pFVar3,(stop_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 6) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_stops_db(&db,&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 6) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x3b0 == 0x19d0) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00117eb6;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_stop((stop_t *)(expected->id + lVar4),(stop_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x3b0;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x1b0;
            greatest_info.msg = "equal_stop(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",6);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x1ae;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",6);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1a3;
          greatest_info.msg = "6 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00117eb6:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_transfers_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/transfers.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x1bf;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/transfers.txt` test file";
      }
      else {
        uVar2 = read_all_transfers((FILE *)pFVar3,(transfer_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_transfers_db(&db,(transfer_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x88 == 0x2a8) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_00118118;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_transfer((transfer_t *)(expected->id + lVar4),
                                     (transfer_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x88;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x1d1;
            greatest_info.msg = "equal_transfer(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x1cf;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1c4;
          greatest_info.msg = "4 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00118562;
      iVar1 = -1;
    }
LAB_00118118:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("db_all_trips_fetch");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      pFVar3 = fopen("../tests/data/stupid_gtfs/trips.txt","r");
      if (pFVar3 == (FILE *)0x0) {
        greatest_info.fail_line = 0x1e0;
        greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/trips.txt` test file";
      }
      else {
        uVar2 = read_all_trips((FILE *)pFVar3,(trip_t **)&expected);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (uVar2 == 4) {
          init_feed_db(&db,"tests_storing.db",1);
          setup_feed_db(&db);
          uVar2 = fetch_all_trips_db(&db,(trip_t **)&local_68);
          greatest_info.assertions = greatest_info.assertions + 1;
          if (uVar2 == 4) {
            lVar4 = 0;
            do {
              if (lVar4 + 0x1cc == 0x8fc) {
                free_feed_db(&db);
                free(local_68);
                free(expected);
                fclose(pFVar3);
                greatest_info.msg = (char *)0x0;
                iVar1 = 0;
                goto LAB_0011837a;
              }
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = equal_trip((trip_t *)(expected->id + lVar4),(trip_t *)(local_68->id + lVar4));
              lVar4 = lVar4 + 0x1cc;
            } while (iVar1 != 0);
            greatest_info.fail_line = 0x1f2;
            greatest_info.msg = "equal_trip(&(expected[i]), &(records[i]))";
          }
          else {
            fwrite("\nExpected: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",4);
            fwrite("\n     Got: ",0xb,1,_stdout);
            fprintf(_stdout,"%i",(ulong)uVar2);
            fputc(10,_stdout);
            greatest_info.fail_line = 0x1f0;
            greatest_info.msg = "expected_count != retrieved_count";
          }
        }
        else {
          fwrite("\nExpected: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",4);
          fwrite("\n     Got: ",0xb,1,_stdout);
          fprintf(_stdout,"%i",(ulong)uVar2);
          fputc(10,_stdout);
          greatest_info.fail_line = 0x1e5;
          greatest_info.msg = "4 != expected_count";
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
      ;
      if ((greatest_info.flags & 4) != 0) {
LAB_00118562:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_fetching.c"
        ;
        abort();
      }
      iVar1 = -1;
    }
LAB_0011837a:
    greatest_test_post(iVar1);
  }
  return;
}

Assistant:

SUITE(CGTFS_DatabaseFetching) {
    RUN_TEST(db_all_agencies_fetch);
    RUN_TEST(db_all_calendar_dates_fetch);
    RUN_TEST(db_all_calendar_records_fetch);
    RUN_TEST(db_all_fare_attributes_fetch);
    RUN_TEST(db_all_fare_rules_fetch);
    RUN_TEST(db_all_feed_info_fetch);
    RUN_TEST(db_all_frequencies_fetch);
    RUN_TEST(db_all_levels_fetch);
    RUN_TEST(db_all_pathways_fetch);
    RUN_TEST(db_all_routes_fetch);
    RUN_TEST(db_all_shapes_fetch);
    RUN_TEST(db_all_stop_times_fetch);
    RUN_TEST(db_all_stops_fetch);
    RUN_TEST(db_all_transfers_fetch);
    RUN_TEST(db_all_trips_fetch);
}